

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_dec_ref_base_pic_marking(nal_t *nal,bs_t *b)

{
  byte *pbVar1;
  prefix_nal_svc_t *ppVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  
  uVar8 = b->bits_left - 1;
  b->bits_left = uVar8;
  pbVar9 = b->p;
  pbVar1 = b->end;
  bVar12 = false;
  if (pbVar9 < pbVar1) {
    bVar12 = (*pbVar9 >> (uVar8 & 0x1f) & 1) != 0;
  }
  if (uVar8 == 0) {
    b->p = pbVar9 + 1;
    b->bits_left = 8;
  }
  ppVar2 = nal->prefix_nal_svc;
  ppVar2->adaptive_ref_base_pic_marking_mode_flag = bVar12;
  if (bVar12) {
    uVar8 = b->bits_left;
    pbVar9 = b->p;
    uVar5 = 0;
    do {
      do {
        uVar4 = uVar5;
        uVar8 = uVar8 - 1;
        b->bits_left = uVar8;
        bVar12 = true;
        if (pbVar9 < pbVar1) {
          bVar12 = (*pbVar9 >> (uVar8 & 0x1f) & 1) == 0;
        }
        if (uVar8 == 0) {
          pbVar9 = pbVar9 + 1;
          b->p = pbVar9;
          b->bits_left = 8;
          uVar8 = 8;
        }
      } while (((bool)(bVar12 & uVar4 < 0x20)) && (uVar5 = uVar4 + 1, pbVar9 < pbVar1));
      if (uVar4 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        uVar7 = uVar4;
        do {
          uVar7 = uVar7 - 1;
          uVar8 = uVar8 - 1;
          b->bits_left = uVar8;
          uVar10 = 0;
          if (pbVar9 < pbVar1) {
            uVar10 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
          }
          if (uVar8 == 0) {
            pbVar9 = pbVar9 + 1;
            b->p = pbVar9;
            b->bits_left = 8;
            uVar8 = 8;
          }
          uVar5 = uVar5 | uVar10 << ((byte)uVar7 & 0x1f);
        } while (uVar7 != 0);
      }
      iVar11 = ~(-1 << ((byte)uVar4 & 0x1f)) + uVar5;
      ppVar2->memory_management_base_control_operation = iVar11;
      if (iVar11 == 1) {
        uVar5 = 0xffffffff;
        iVar3 = -2;
        do {
          iVar6 = iVar3;
          uVar4 = uVar5;
          uVar8 = uVar8 - 1;
          b->bits_left = uVar8;
          bVar12 = true;
          if (pbVar9 < pbVar1) {
            bVar12 = (*pbVar9 >> (uVar8 & 0x1f) & 1) == 0;
          }
          if (uVar8 == 0) {
            pbVar9 = pbVar9 + 1;
            b->p = pbVar9;
            b->bits_left = 8;
            uVar8 = 8;
          }
          uVar5 = uVar4 + 1;
        } while (((bool)(bVar12 & uVar5 < 0x20)) && (iVar3 = iVar6 + 1, pbVar9 < pbVar1));
        uVar7 = 0;
        if (uVar5 != 0) {
          do {
            uVar8 = uVar8 - 1;
            b->bits_left = uVar8;
            uVar10 = 0;
            if (pbVar9 < pbVar1) {
              uVar10 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
            }
            if (uVar8 == 0) {
              pbVar9 = pbVar9 + 1;
              b->p = pbVar9;
              b->bits_left = 8;
              uVar8 = 8;
            }
            uVar7 = uVar7 | uVar10 << ((byte)uVar4 & 0x1f);
            uVar4 = uVar4 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        ppVar2->difference_of_base_pic_nums_minus1 = ~(-1 << ((byte)uVar5 & 0x1f)) + uVar7;
      }
      if (iVar11 == 2) {
        uVar5 = 0xffffffff;
        iVar3 = -2;
        do {
          iVar6 = iVar3;
          uVar4 = uVar5;
          uVar8 = uVar8 - 1;
          b->bits_left = uVar8;
          bVar12 = true;
          if (pbVar9 < pbVar1) {
            bVar12 = (*pbVar9 >> (uVar8 & 0x1f) & 1) == 0;
          }
          if (uVar8 == 0) {
            pbVar9 = pbVar9 + 1;
            b->p = pbVar9;
            b->bits_left = 8;
            uVar8 = 8;
          }
          uVar5 = uVar4 + 1;
        } while (((bool)(bVar12 & uVar5 < 0x20)) && (iVar3 = iVar6 + 1, pbVar9 < pbVar1));
        uVar7 = 0;
        if (uVar5 != 0) {
          do {
            uVar8 = uVar8 - 1;
            b->bits_left = uVar8;
            uVar10 = 0;
            if (pbVar9 < pbVar1) {
              uVar10 = (uint)((*pbVar9 >> (uVar8 & 0x1f) & 1) != 0);
            }
            if (uVar8 == 0) {
              pbVar9 = pbVar9 + 1;
              b->p = pbVar9;
              b->bits_left = 8;
              uVar8 = 8;
            }
            uVar7 = uVar7 | uVar10 << ((byte)uVar4 & 0x1f);
            uVar4 = uVar4 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        ppVar2->long_term_base_pic_num = ~(-1 << ((byte)uVar5 & 0x1f)) + uVar7;
      }
      uVar5 = 0;
    } while (iVar11 != 0);
  }
  return;
}

Assistant:

void read_dec_ref_base_pic_marking(nal_t* nal, bs_t* b)
{
    nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag = bs_read_u1(b);
    if( nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag )
    {
        do {
            nal->prefix_nal_svc->memory_management_base_control_operation = bs_read_ue(b);
            
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 1 )
            {
                nal->prefix_nal_svc->difference_of_base_pic_nums_minus1 = bs_read_ue(b);
            }
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 2 )
            {
                nal->prefix_nal_svc->long_term_base_pic_num = bs_read_ue(b);
            }
        } while( nal->prefix_nal_svc->memory_management_base_control_operation != 0 );
    }
}